

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calc_state_machine.hxx
# Opt level: O2

bool __thiscall
calc_server::calc_state_machine::apply_snapshot(calc_state_machine *this,snapshot *s)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  ptr<snapshot_ctx> ctx;
  __shared_ptr<calc_server::calc_state_machine::snapshot_ctx,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::mutex::lock(&this->snapshots_lock_);
  local_40._M_ptr = (element_type *)s->last_log_idx_;
  iVar2 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>_>_>
          ::find(&(this->snapshots_)._M_t,(key_type *)&local_40);
  p_Var1 = &(this->snapshots_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar2._M_node != p_Var1) {
    std::__shared_ptr<calc_server::calc_state_machine::snapshot_ctx,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_40,
                 (__shared_ptr<calc_server::calc_state_machine::snapshot_ctx,_(__gnu_cxx::_Lock_policy)2>
                  *)&iVar2._M_node[1]._M_parent);
    LOCK();
    (this->cur_value_).super___atomic_base<long>._M_i = (local_40._M_ptr)->value_;
    UNLOCK();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->snapshots_lock_);
  return (_Rb_tree_header *)iVar2._M_node != p_Var1;
}

Assistant:

bool apply_snapshot(snapshot& s) {
        std::lock_guard<std::mutex> ll(snapshots_lock_);
        auto entry = snapshots_.find(s.get_last_log_idx());
        if (entry == snapshots_.end()) return false;

        ptr<snapshot_ctx> ctx = entry->second;
        cur_value_ = ctx->value_;
        return true;
    }